

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_debug_helpers_generated.c
# Opt level: O0

char * mbedtls_ssl_protocol_version_str(mbedtls_ssl_protocol_version in)

{
  char *pcStack_10;
  mbedtls_ssl_protocol_version in_local;
  
  if (in == MBEDTLS_SSL_VERSION_UNKNOWN) {
    pcStack_10 = "MBEDTLS_SSL_VERSION_UNKNOWN";
  }
  else if (in == MBEDTLS_SSL_VERSION_TLS1_2) {
    pcStack_10 = "MBEDTLS_SSL_VERSION_TLS1_2";
  }
  else if (in == MBEDTLS_SSL_VERSION_TLS1_3) {
    pcStack_10 = "MBEDTLS_SSL_VERSION_TLS1_3";
  }
  else {
    pcStack_10 = "UNKNOWN_VALUE";
  }
  return pcStack_10;
}

Assistant:

const char *mbedtls_ssl_protocol_version_str( mbedtls_ssl_protocol_version in )
{
    switch (in) {
        case MBEDTLS_SSL_VERSION_UNKNOWN:
            return "MBEDTLS_SSL_VERSION_UNKNOWN";
        case MBEDTLS_SSL_VERSION_TLS1_2:
            return "MBEDTLS_SSL_VERSION_TLS1_2";
        case MBEDTLS_SSL_VERSION_TLS1_3:
            return "MBEDTLS_SSL_VERSION_TLS1_3";
        default:
            return "UNKNOWN_VALUE";
    }
}